

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O3

char * lj_debug_uvnamev(cTValue *o,uint32_t idx,TValue **tvp,GCobj **op)

{
  char cVar1;
  GCobj *pGVar2;
  char *pcVar3;
  ulong uVar4;
  
  if ((o->field_2).it != 0xfffffff7) {
    return (char *)0x0;
  }
  pGVar2 = (GCobj *)(ulong)(o->u32).lo;
  if ((pGVar2->gch).unused1 == '\0') {
    uVar4 = (ulong)(pGVar2->gch).metatable.gcptr32;
    if (*(byte *)(uVar4 - 0x1c) <= idx) {
      return (char *)0x0;
    }
    pGVar2 = (GCobj *)(ulong)*(uint *)((long)pGVar2 + (ulong)idx * 4 + 0x14);
    *tvp = (TValue *)(ulong)(pGVar2->gch).metatable.gcptr32;
    *op = pGVar2;
    pcVar3 = (char *)(ulong)*(uint *)(uVar4 - 8);
    if (pcVar3 != (char *)0x0) {
      if (idx != 0) {
        do {
          do {
            cVar1 = *pcVar3;
            pcVar3 = pcVar3 + 1;
          } while (cVar1 != '\0');
          idx = idx - 1;
        } while (idx != 0);
      }
      return pcVar3;
    }
  }
  else {
    if ((pGVar2->gch).unused2 <= idx) {
      return (char *)0x0;
    }
    *tvp = (TValue *)((long)pGVar2 + (ulong)idx * 8 + 0x20);
    *op = pGVar2;
  }
  return "";
}

Assistant:

const char *lj_debug_uvnamev(cTValue *o, uint32_t idx, TValue **tvp, GCobj **op)
{
  if (tvisfunc(o)) {
    GCfunc *fn = funcV(o);
    if (isluafunc(fn)) {
      GCproto *pt = funcproto(fn);
      if (idx < pt->sizeuv) {
	GCobj *uvo = gcref(fn->l.uvptr[idx]);
	*tvp = uvval(&uvo->uv);
	*op = uvo;
	return lj_debug_uvname(pt, idx);
      }
    } else {
      if (idx < fn->c.nupvalues) {
	*tvp = &fn->c.upvalue[idx];
	*op = obj2gco(fn);
	return "";
      }
    }
  }
  return NULL;
}